

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse41_128_32.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_table_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  int iVar2;
  parasail_matrix_t *ppVar3;
  void *pvVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  longlong lVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  __m128i *palVar15;
  __m128i *palVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  __m128i *ptr;
  int32_t *ptr_00;
  undefined8 *puVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  int iVar30;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  int iVar35;
  ulong uVar31;
  __m128i vH_00;
  __m128i vH_01;
  int32_t in_stack_fffffffffffff8c8;
  ulong local_730;
  int local_724;
  int32_t local_720;
  int local_714;
  long local_710;
  int local_708;
  int local_700;
  int local_6fc;
  ulong uStack_6f8;
  __m128i vH_1;
  int32_t temp;
  int32_t column_len;
  int32_t *t;
  __m128i vCompare;
  int32_t tmp2;
  int64_t tmp_2;
  __m128i *pv;
  __m128i *vP;
  __m128i vH;
  __m128i vF;
  __m128i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_32_t e;
  __m128i_32_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vPosMask;
  __m128i vMaxH;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int32_t score;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int32_t *boundary;
  __m128i *pvE;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int s1_beg_local;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  int local_388;
  int iStack_384;
  int iStack_380;
  int iStack_37c;
  int local_378;
  int iStack_374;
  int iStack_370;
  int iStack_36c;
  int local_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  int local_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  int local_2e8;
  int iStack_2e4;
  int iStack_2e0;
  int iStack_2dc;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int local_228;
  int iStack_224;
  int iStack_220;
  int iStack_21c;
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_striped_profile_sse41_128_32",
            "profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile32).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_striped_profile_sse41_128_32",
            "profile->profile32.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_striped_profile_sse41_128_32",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_striped_profile_sse41_128_32",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_striped_profile_sse41_128_32","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_striped_profile_sse41_128_32",
            "s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_striped_profile_sse41_128_32",
            "open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_striped_profile_sse41_128_32",
            "gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    matrix._0_4_ = s2Len + -1;
    ppVar3 = profile->matrix;
    iVar17 = (iVar1 + 3) / 4;
    iVar23 = (iVar1 + -1) % iVar17;
    uVar18 = ~((iVar1 + -1) / iVar17);
    iVar19 = uVar18 + 4;
    pvVar4 = (profile->profile32).score;
    if (-open < ppVar3->min) {
      local_6fc = open + -0x80000000;
    }
    else {
      local_6fc = -0x80000000 - ppVar3->min;
    }
    local_6fc = local_6fc + 1;
    iVar20 = 0x7ffffffe - ppVar3->max;
    lVar10 = CONCAT44(local_6fc,local_6fc);
    lVar11 = CONCAT44(local_6fc,local_6fc);
    vSaturationCheckMax[1] = CONCAT44(iVar20,iVar20);
    vSaturationCheckMin[0] = CONCAT44(iVar20,iVar20);
    result._0_4_ = -(uint)(iVar19 == 3);
    result._4_4_ = -(uint)(iVar19 == 2);
    vPosMask[0]._0_4_ = -(uint)(iVar19 == 1);
    vPosMask[0]._4_4_ = -(uint)(uVar18 == 0xfffffffc);
    iVar21 = s1_beg;
    vPosMask[1] = lVar10;
    _segNum = (parasail_profile_t *)parasail_result_new_table1(iVar17 * 4,s2Len);
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x4400802;
      uVar18 = 0;
      if (s1_beg != 0) {
        uVar18 = 8;
      }
      *(uint *)&_segNum->field_0xc = uVar18 | *(uint *)&_segNum->field_0xc;
      uVar18 = 0;
      if (s1_end != 0) {
        uVar18 = 0x10;
      }
      *(uint *)&_segNum->field_0xc = uVar18 | *(uint *)&_segNum->field_0xc;
      uVar18 = 0;
      if (s2_beg != 0) {
        uVar18 = 0x4000;
      }
      *(uint *)&_segNum->field_0xc = uVar18 | *(uint *)&_segNum->field_0xc;
      uVar18 = 0;
      if (s2_end != 0) {
        uVar18 = 0x8000;
      }
      *(uint *)&_segNum->field_0xc = uVar18 | *(uint *)&_segNum->field_0xc;
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x20000;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar17);
      pvE = parasail_memalign___m128i(0x10,(long)iVar17);
      ptr = parasail_memalign___m128i(0x10,(long)iVar17);
      ptr_00 = parasail_memalign_int32_t(0x10,(long)(s2Len + 1));
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int32_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        h.v[3] = 0;
        for (k = 0; k < iVar17; k = k + 1) {
          for (h.v[2] = 0; h.v[2] < 4; h.v[2] = h.v[2] + 1) {
            if (s1_beg == 0) {
              local_700 = -(gap * (h.v[2] * iVar17 + k)) - open;
            }
            else {
              local_700 = 0;
            }
            local_708 = local_700;
            if ((long)local_700 < -0x80000000) {
              local_708 = -0x80000000;
            }
            *(int *)((long)&e + (long)h.v[2] * 4 + 8) = local_708;
            local_710 = (long)local_700 - (long)open;
            if (local_710 < -0x80000000) {
              local_710 = -0x80000000;
            }
            *(int *)((long)&tmp + (long)h.v[2] * 4) = (int)local_710;
          }
          pvHLoad[h.v[3]][0] = e.m[1];
          pvHLoad[h.v[3]][1] = h.m[0];
          ptr[h.v[3]][0] = tmp;
          ptr[h.v[3]][1] = e.m[0];
          h.v[3] = h.v[3] + 1;
        }
        *ptr_00 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          if (s2_beg == 0) {
            local_714 = -(gap * (k + -1)) - open;
          }
          else {
            local_714 = 0;
          }
          local_720 = local_714;
          if (local_714 < -0x80000000) {
            local_720 = -0x80000000;
          }
          ptr_00[k] = local_720;
        }
        vMaxH[0] = lVar11;
        vMaxH[1] = lVar10;
        vSaturationCheckMax[0] = lVar11;
        for (s1Len = 0; palVar16 = pvHLoad, palVar15 = pvE, s1Len < s2Len; s1Len = s1Len + 1) {
          uVar31 = pvHLoad[iVar17 + -1][0];
          vH[0] = pvHLoad[iVar17 + -1][1] << 0x20 | uVar31 >> 0x20;
          iVar2 = ppVar3->mapper[(byte)s2[s1Len]];
          pvE = pvHLoad;
          pvHLoad = palVar15;
          vP = (__m128i *)(uVar31 << 0x20 | (ulong)(uint)ptr_00[s1Len]);
          vH[1] = lVar10;
          vF[0] = lVar11;
          for (k = 0; k < iVar17; k = k + 1) {
            puVar22 = (undefined8 *)((long)pvVar4 + (long)k * 0x10 + (long)(iVar2 * iVar17) * 0x10);
            uVar6 = *puVar22;
            uVar7 = puVar22[1];
            local_378 = (int)vP;
            iStack_374 = (int)((ulong)vP >> 0x20);
            iStack_370 = (int)vH[0];
            iStack_36c = (int)((ulong)vH[0] >> 0x20);
            local_388 = (int)uVar6;
            iStack_384 = (int)((ulong)uVar6 >> 0x20);
            iStack_380 = (int)uVar7;
            iStack_37c = (int)((ulong)uVar7 >> 0x20);
            local_378 = local_378 + local_388;
            iStack_374 = iStack_374 + iStack_384;
            iStack_370 = iStack_370 + iStack_380;
            iStack_36c = iStack_36c + iStack_37c;
            lVar8 = ptr[k][0];
            lVar9 = ptr[k][1];
            local_258 = (int)lVar8;
            iStack_254 = (int)((ulong)lVar8 >> 0x20);
            iStack_250 = (int)lVar9;
            iStack_24c = (int)((ulong)lVar9 >> 0x20);
            uVar18 = (uint)(local_378 < local_258) * local_258 |
                     (uint)(local_378 >= local_258) * local_378;
            uVar25 = (uint)(iStack_374 < iStack_254) * iStack_254 |
                     (uint)(iStack_374 >= iStack_254) * iStack_374;
            uVar28 = (uint)(iStack_370 < iStack_250) * iStack_250 |
                     (uint)(iStack_370 >= iStack_250) * iStack_370;
            uVar32 = (uint)(iStack_36c < iStack_24c) * iStack_24c |
                     (uint)(iStack_36c >= iStack_24c) * iStack_36c;
            local_278 = (int)vH[1];
            iStack_274 = (int)((ulong)vH[1] >> 0x20);
            iStack_270 = (int)vF[0];
            iStack_26c = (int)((ulong)vF[0] >> 0x20);
            uVar18 = (uint)((int)uVar18 < local_278) * local_278 |
                     ((int)uVar18 >= local_278) * uVar18;
            uVar26 = (uint)((int)uVar25 < iStack_274) * iStack_274 |
                     ((int)uVar25 >= iStack_274) * uVar25;
            uVar29 = (uint)((int)uVar28 < iStack_270) * iStack_270 |
                     ((int)uVar28 >= iStack_270) * uVar28;
            uVar33 = (uint)((int)uVar32 < iStack_26c) * iStack_26c |
                     ((int)uVar32 >= iStack_26c) * uVar32;
            vP = (__m128i *)CONCAT44(uVar26,uVar18);
            vH[0] = CONCAT44(uVar33,uVar29);
            palVar15[k][0] = (longlong)vP;
            palVar15[k][1] = vH[0];
            local_288 = (int)vMaxH[1];
            iStack_284 = (int)((ulong)vMaxH[1] >> 0x20);
            iStack_280 = (int)vSaturationCheckMax[0];
            iStack_27c = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
            vMaxH[1] = CONCAT44((iStack_284 < (int)uVar26) * uVar26 |
                                (uint)(iStack_284 >= (int)uVar26) * iStack_284,
                                (local_288 < (int)uVar18) * uVar18 |
                                (uint)(local_288 >= (int)uVar18) * local_288);
            vSaturationCheckMax[0] =
                 CONCAT44((iStack_27c < (int)uVar33) * uVar33 |
                          (uint)(iStack_27c >= (int)uVar33) * iStack_27c,
                          (iStack_280 < (int)uVar29) * uVar29 |
                          (uint)(iStack_280 >= (int)uVar29) * iStack_280);
            local_1c8 = (int)vSaturationCheckMax[1];
            iStack_1c4 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
            iStack_1c0 = (int)vSaturationCheckMin[0];
            iStack_1bc = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
            uVar25 = ((int)uVar18 < local_1c8) * uVar18 |
                     (uint)((int)uVar18 >= local_1c8) * local_1c8;
            uVar28 = ((int)uVar26 < iStack_1c4) * uVar26 |
                     (uint)((int)uVar26 >= iStack_1c4) * iStack_1c4;
            uVar32 = ((int)uVar29 < iStack_1c0) * uVar29 |
                     (uint)((int)uVar29 >= iStack_1c0) * iStack_1c0;
            uVar34 = ((int)uVar33 < iStack_1bc) * uVar33 |
                     (uint)((int)uVar33 >= iStack_1bc) * iStack_1bc;
            uVar25 = (uint)(local_258 < (int)uVar25) * local_258 |
                     (local_258 >= (int)uVar25) * uVar25;
            uVar28 = (uint)(iStack_254 < (int)uVar28) * iStack_254 |
                     (iStack_254 >= (int)uVar28) * uVar28;
            uVar32 = (uint)(iStack_250 < (int)uVar32) * iStack_250 |
                     (iStack_250 >= (int)uVar32) * uVar32;
            uVar34 = (uint)(iStack_24c < (int)uVar34) * iStack_24c |
                     (iStack_24c >= (int)uVar34) * uVar34;
            vSaturationCheckMax[1] =
                 CONCAT44((uint)(iStack_274 < (int)uVar28) * iStack_274 |
                          (iStack_274 >= (int)uVar28) * uVar28,
                          (uint)(local_278 < (int)uVar25) * local_278 |
                          (local_278 >= (int)uVar25) * uVar25);
            vSaturationCheckMin[0] =
                 CONCAT44((uint)(iStack_26c < (int)uVar34) * iStack_26c |
                          (iStack_26c >= (int)uVar34) * uVar34,
                          (uint)(iStack_270 < (int)uVar32) * iStack_270 |
                          (iStack_270 >= (int)uVar32) * uVar32);
            vH_00[0] = (ulong)(uint)k;
            vH_00[1]._0_4_ = iVar17;
            vH_00[1]._4_4_ = 0;
            arr_store_si128(((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                            rowcols->score_row,vH_00,s1Len,s2Len,iVar21,in_stack_fffffffffffff8c8);
            iVar24 = uVar18 - open;
            iVar27 = uVar26 - open;
            iVar30 = uVar29 - open;
            iVar35 = uVar33 - open;
            local_258 = local_258 - gap;
            iStack_254 = iStack_254 - gap;
            iStack_250 = iStack_250 - gap;
            iStack_24c = iStack_24c - gap;
            vF[1] = CONCAT44((uint)(iStack_254 < iVar27) * iVar27 |
                             (uint)(iStack_254 >= iVar27) * iStack_254,
                             (uint)(local_258 < iVar24) * iVar24 |
                             (uint)(local_258 >= iVar24) * local_258);
            vE[0] = CONCAT44((uint)(iStack_24c < iVar35) * iVar35 |
                             (uint)(iStack_24c >= iVar35) * iStack_24c,
                             (uint)(iStack_250 < iVar30) * iVar30 |
                             (uint)(iStack_250 >= iVar30) * iStack_250);
            ptr[k][0] = vF[1];
            ptr[k][1] = vE[0];
            local_278 = local_278 - gap;
            iStack_274 = iStack_274 - gap;
            iStack_270 = iStack_270 - gap;
            iStack_26c = iStack_26c - gap;
            vH[1] = CONCAT44((uint)(iStack_274 < iVar27) * iVar27 |
                             (uint)(iStack_274 >= iVar27) * iStack_274,
                             (uint)(local_278 < iVar24) * iVar24 |
                             (uint)(local_278 >= iVar24) * local_278);
            vF[0] = CONCAT44((uint)(iStack_26c < iVar35) * iVar35 |
                             (uint)(iStack_26c >= iVar35) * iStack_26c,
                             (uint)(iStack_270 < iVar30) * iVar30 |
                             (uint)(iStack_270 >= iVar30) * iStack_270);
            vP = (__m128i *)palVar16[k][0];
            vH[0] = palVar16[k][1];
          }
          for (end_query = 0; end_query < 4; end_query = end_query + 1) {
            if (s2_beg == 0) {
              local_724 = ptr_00[s1Len + 1] - open;
            }
            else {
              local_724 = -open;
            }
            local_730 = (ulong)local_724;
            if ((long)local_730 < -0x80000000) {
              local_730 = 0xffffffff80000000;
            }
            vF[0] = vF[0] << 0x20 | (ulong)vH[1] >> 0x20;
            vH[1] = vH[1] << 0x20 | local_730 & 0xffffffff;
            for (k = 0; k < iVar17; k = k + 1) {
              lVar8 = palVar15[k][0];
              lVar9 = palVar15[k][1];
              local_2e8 = (int)lVar8;
              iStack_2e4 = (int)((ulong)lVar8 >> 0x20);
              iStack_2e0 = (int)lVar9;
              iStack_2dc = (int)((ulong)lVar9 >> 0x20);
              local_2f8 = (int)vH[1];
              iStack_2f4 = (int)((ulong)vH[1] >> 0x20);
              iStack_2f0 = (int)vF[0];
              iStack_2ec = (int)((ulong)vF[0] >> 0x20);
              uVar18 = (uint)(local_2e8 < local_2f8) * local_2f8 |
                       (uint)(local_2e8 >= local_2f8) * local_2e8;
              uVar25 = (uint)(iStack_2e4 < iStack_2f4) * iStack_2f4 |
                       (uint)(iStack_2e4 >= iStack_2f4) * iStack_2e4;
              uVar26 = (uint)(iStack_2e0 < iStack_2f0) * iStack_2f0 |
                       (uint)(iStack_2e0 >= iStack_2f0) * iStack_2e0;
              uVar28 = (uint)(iStack_2dc < iStack_2ec) * iStack_2ec |
                       (uint)(iStack_2dc >= iStack_2ec) * iStack_2dc;
              vP = (__m128i *)CONCAT44(uVar25,uVar18);
              vH[0] = CONCAT44(uVar28,uVar26);
              palVar15[k][0] = (longlong)vP;
              palVar15[k][1] = vH[0];
              local_228 = (int)vSaturationCheckMax[1];
              iStack_224 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
              iStack_220 = (int)vSaturationCheckMin[0];
              iStack_21c = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
              vSaturationCheckMax[1] =
                   CONCAT44(((int)uVar25 < iStack_224) * uVar25 |
                            (uint)((int)uVar25 >= iStack_224) * iStack_224,
                            ((int)uVar18 < local_228) * uVar18 |
                            (uint)((int)uVar18 >= local_228) * local_228);
              vSaturationCheckMin[0] =
                   CONCAT44(((int)uVar28 < iStack_21c) * uVar28 |
                            (uint)((int)uVar28 >= iStack_21c) * iStack_21c,
                            ((int)uVar26 < iStack_220) * uVar26 |
                            (uint)((int)uVar26 >= iStack_220) * iStack_220);
              local_308 = (int)vMaxH[1];
              iStack_304 = (int)((ulong)vMaxH[1] >> 0x20);
              iStack_300 = (int)vSaturationCheckMax[0];
              iStack_2fc = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
              vMaxH[1] = CONCAT44((iStack_304 < (int)uVar25) * uVar25 |
                                  (uint)(iStack_304 >= (int)uVar25) * iStack_304,
                                  (local_308 < (int)uVar18) * uVar18 |
                                  (uint)(local_308 >= (int)uVar18) * local_308);
              vSaturationCheckMax[0] =
                   CONCAT44((iStack_2fc < (int)uVar28) * uVar28 |
                            (uint)(iStack_2fc >= (int)uVar28) * iStack_2fc,
                            (iStack_300 < (int)uVar26) * uVar26 |
                            (uint)(iStack_300 >= (int)uVar26) * iStack_300);
              vH_01[0] = (ulong)(uint)k;
              vH_01[1]._0_4_ = iVar17;
              vH_01[1]._4_4_ = 0;
              arr_store_si128(((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                              rowcols->score_row,vH_01,s1Len,s2Len,iVar21,in_stack_fffffffffffff8c8)
              ;
              iStack_2ec = iStack_2ec - gap;
              vH[1] = CONCAT44(iStack_2f4 - gap,local_2f8 - gap);
              vF[0] = CONCAT44(iStack_2ec,iStack_2f0 - gap);
              bVar5 = (int)(uVar28 - open) < iStack_2ec;
              uVar28 = -(uint)bVar5;
              auVar14._4_4_ = -(uint)((int)(uVar25 - open) < iStack_2f4 - gap);
              auVar14._0_4_ = -(uint)((int)(uVar18 - open) < local_2f8 - gap);
              auVar14._8_4_ = -(uint)((int)(uVar26 - open) < iStack_2f0 - gap);
              auVar14._12_4_ = uVar28;
              if ((((((((((((((((auVar14 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar14 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar14 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar14 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar14 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar14 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar14 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar14 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar14 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar14 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar14 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar14 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (uVar28 >> 7 & 1) == 0) && (uVar28 >> 0xf & 1) == 0) &&
                  (uVar28 >> 0x17 & 1) == 0) && !bVar5) goto LAB_0099398e;
            }
          }
LAB_0099398e:
          lVar8 = palVar15[iVar23][0];
          lVar9 = palVar15[iVar23][1];
          local_b8 = (int)lVar8;
          iStack_b4 = (int)((ulong)lVar8 >> 0x20);
          iStack_b0 = (int)lVar9;
          iStack_ac = (int)((ulong)lVar9 >> 0x20);
          local_c8 = (int)vPosMask[1];
          iStack_c4 = (int)((ulong)vPosMask[1] >> 0x20);
          iStack_c0 = (int)vMaxH[0];
          iStack_bc = (int)((ulong)vMaxH[0] >> 0x20);
          uVar31 = CONCAT44(vPosMask[0]._4_4_,(int)vPosMask[0]) &
                   CONCAT44(-(uint)(iStack_bc < iStack_ac),-(uint)(iStack_c0 < iStack_b0));
          vPosMask[1] = CONCAT44((uint)(iStack_b4 < iStack_c4) * iStack_c4 |
                                 (uint)(iStack_b4 >= iStack_c4) * iStack_b4,
                                 (uint)(local_b8 < local_c8) * local_c8 |
                                 (uint)(local_b8 >= local_c8) * local_b8);
          vMaxH[0] = CONCAT44((uint)(iStack_ac < iStack_bc) * iStack_bc |
                              (uint)(iStack_ac >= iStack_bc) * iStack_ac,
                              (uint)(iStack_b0 < iStack_c0) * iStack_c0 |
                              (uint)(iStack_b0 >= iStack_c0) * iStack_b0);
          auVar13._8_8_ = uVar31;
          auVar13._0_8_ =
               CONCAT44(result._4_4_,(int)result) &
               CONCAT44(-(uint)(iStack_c4 < iStack_b4),-(uint)(local_c8 < local_b8));
          if ((((((((((((((((auVar13 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar13 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar13 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar13 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar13 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar13 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar13 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar13 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (uVar31 >> 7 & 1) != 0) || (uVar31 >> 0xf & 1) != 0) ||
                  (uVar31 >> 0x17 & 1) != 0) || (uVar31 >> 0x1f & 1) != 0) ||
                (uVar31 >> 0x27 & 1) != 0) || (uVar31 >> 0x2f & 1) != 0) ||
              (uVar31 >> 0x37 & 1) != 0) || (long)uVar31 < 0) {
            matrix._0_4_ = s1Len;
          }
        }
        vNegLimit[1]._4_4_ = local_6fc;
        if (s2_end != 0) {
          for (end_query = 0; end_query < iVar19; end_query = end_query + 1) {
            vMaxH[0] = vMaxH[0] << 0x20 | (ulong)vPosMask[1] >> 0x20;
            vPosMask[1] = vPosMask[1] << 0x20;
          }
          vNegLimit[1]._4_4_ = vMaxH[0]._4_4_;
        }
        matrix._4_4_ = iVar1 + -1;
        if (s1_end != 0) {
          _temp = pvHLoad;
          for (k = 0; k < iVar17 * 4; k = k + 1) {
            iVar21 = k / 4 + (k % 4) * iVar17;
            if (iVar21 < iVar1) {
              if (vNegLimit[1]._4_4_ < (int)(*_temp)[0]) {
                vNegLimit[1]._4_4_ = (int)(*_temp)[0];
                matrix._0_4_ = s2Len + -1;
                matrix._4_4_ = iVar21;
              }
              else if ((((int)(*_temp)[0] == vNegLimit[1]._4_4_) && ((int)matrix == s2Len + -1)) &&
                      (iVar21 < matrix._4_4_)) {
                matrix._4_4_ = iVar21;
              }
            }
            _temp = (__m128i *)((long)*_temp + 4);
          }
        }
        if ((s1_end == 0) && (s2_end == 0)) {
          vH_1[0] = pvHLoad[iVar23][1];
          uStack_6f8 = pvHLoad[iVar23][0];
          for (end_query = 0; end_query < iVar19; end_query = end_query + 1) {
            vH_1[0] = vH_1[0] << 0x20 | uStack_6f8 >> 0x20;
            uStack_6f8 = uStack_6f8 << 0x20;
          }
          vNegLimit[1]._4_4_ = vH_1[0]._4_4_;
          matrix._0_4_ = s2Len + -1;
          matrix._4_4_ = iVar1 + -1;
        }
        local_28 = (int)vSaturationCheckMax[1];
        iStack_24 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
        iStack_20 = (int)vSaturationCheckMin[0];
        iStack_1c = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
        local_d8 = (int)vMaxH[1];
        iStack_d4 = (int)((ulong)vMaxH[1] >> 0x20);
        iStack_d0 = (int)vSaturationCheckMax[0];
        iStack_cc = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
        uVar31 = CONCAT44(-(uint)(iStack_1c < local_6fc),-(uint)(iStack_20 < local_6fc)) |
                 CONCAT44(-(uint)(iVar20 < iStack_cc),-(uint)(iVar20 < iStack_d0));
        auVar12._8_8_ = uVar31;
        auVar12._0_8_ =
             CONCAT44(-(uint)(iStack_24 < local_6fc),-(uint)(local_28 < local_6fc)) |
             CONCAT44(-(uint)(iVar20 < iStack_d4),-(uint)(iVar20 < local_d8));
        if ((((((((((((((((auVar12 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar12 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar12 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar12 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar12 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar12 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar12 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar12 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar31 >> 7 & 1) != 0) || (uVar31 >> 0xf & 1) != 0) || (uVar31 >> 0x17 & 1) != 0)
               || (uVar31 >> 0x1f & 1) != 0) || (uVar31 >> 0x27 & 1) != 0) ||
             (uVar31 >> 0x2f & 1) != 0) || (uVar31 >> 0x37 & 1) != 0) || (long)uVar31 < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          vNegLimit[1]._4_4_ = 0;
          matrix._4_4_ = 0;
          matrix._0_4_ = 0;
        }
        *(int *)&_segNum->s1 = vNegLimit[1]._4_4_;
        *(int *)((long)&_segNum->s1 + 4) = matrix._4_4_;
        _segNum->s1Len = (int)matrix;
        parasail_free(ptr_00);
        parasail_free(ptr);
        parasail_free(pvE);
        parasail_free(pvHLoad);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 4);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32(vH, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vF = _mm_slli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi32(vH, vMaxH));
            vMaxH = _mm_max_epi32(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
        }
        score = (int32_t) _mm_extract_epi32(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            score = (int32_t) _mm_extract_epi32 (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}